

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::attachmentQueryTexCubeTest(TestContext *testCtx,Context *ctx)

{
  Context *ctx_local;
  TestContext *testCtx_local;
  
  (*ctx->_vptr_Context[9])(ctx,0x8d40,1);
  (*ctx->_vptr_Context[6])(ctx,0x8513,2);
  (*ctx->_vptr_Context[0x1e])(ctx,0x8d40,0x8d00,0x8518,2,0);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd0,0x1702);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd1,2);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd2,0);
  checkFboAttachmentParam(testCtx,ctx,0x8d00,0x8cd3,0x8518);
  return;
}

Assistant:

static void attachmentQueryTexCubeTest (tcu::TestContext& testCtx, sglr::Context& ctx)
{
	ctx.bindFramebuffer(GL_FRAMEBUFFER, 1);

	ctx.bindTexture(GL_TEXTURE_CUBE_MAP, 2);
	ctx.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 2, 0);

	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE, GL_TEXTURE);
	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME, 2);
	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL, 0);
	checkFboAttachmentParam(testCtx, ctx, GL_DEPTH_ATTACHMENT, GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE, GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
}